

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStringEq(InternalAnalyzer *this,StringEq *curr)

{
  if ((*(int *)(curr + 0x10) == 1) &&
     ((6 < *(ulong *)(*(long *)(curr + 0x18) + 8) &&
       ((uint)*(ulong *)(*(long *)(curr + 0x18) + 8) & 3) == 2 ||
      (((uint)*(ulong *)(*(long *)(curr + 0x20) + 8) & 3) == 2 &&
       6 < *(ulong *)(*(long *)(curr + 0x20) + 8))))) {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
      if (curr->op == StringEqCompare) {
        // traps when either input is null.
        if (curr->left->type.isNullable() || curr->right->type.isNullable()) {
          parent.implicitTrap = true;
        }
      }
    }